

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O1

PixelBufferAccess *
glu::getTextureBufferEffectiveRefTexture
          (PixelBufferAccess *__return_storage_ptr__,TextureBuffer *buffer,int maxTextureBufferSize)

{
  IVec3 local_4c;
  TextureFormat local_40;
  int local_38;
  IVec3 local_2c;
  void *local_20;
  
  TextureBuffer::getFullRefTexture((PixelBufferAccess *)&local_40,buffer);
  if (local_38 < maxTextureBufferSize) {
    maxTextureBufferSize = local_38;
  }
  local_4c.m_data[1] = 1;
  local_4c.m_data[2] = 1;
  local_4c.m_data[0] = maxTextureBufferSize;
  tcu::PixelBufferAccess::PixelBufferAccess
            (__return_storage_ptr__,&local_40,&local_4c,&local_2c,local_20);
  return __return_storage_ptr__;
}

Assistant:

tcu::PixelBufferAccess getTextureBufferEffectiveRefTexture (TextureBuffer& buffer, int maxTextureBufferSize)
{
	DE_ASSERT(maxTextureBufferSize > 0);

	const tcu::PixelBufferAccess& fullAccess = buffer.getFullRefTexture();

	return tcu::PixelBufferAccess(fullAccess.getFormat(),
								  tcu::IVec3(de::min(fullAccess.getWidth(), maxTextureBufferSize), 1, 1),
								  fullAccess.getPitch(),
								  fullAccess.getDataPtr());
}